

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_function_primitive_hasOverrideDispatch
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_bitflags_t sVar1;
  sysbvm_tuple_t sVar2;
  size_t flags;
  sysbvm_tuple_t *function;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  sVar1 = sysbvm_function_getFlags(context,*arguments);
  sVar2 = sysbvm_tuple_boolean_encode((sVar1 & 0x80) != 0);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_function_primitive_hasOverrideDispatch(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_tuple_t *function = &arguments[0];
    size_t flags = sysbvm_function_getFlags(context, *function);
    return sysbvm_tuple_boolean_encode((flags & SYSBVM_FUNCTION_FLAGS_OVERRIDE) != 0);
}